

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtable.c
# Opt level: O1

BOOL installMethodInDtable
               (Class class,SparseArray *dtable,objc_method *method,objc_method *method_to_replace,
               BOOL replaceExisting)

{
  BOOL BVar1;
  
  BVar1 = (*(code *)(&DAT_001205d8 +
                    *(int *)(&DAT_001205d8 + (ulong)(dtable->shift << 0x1d | dtable->shift >> 3) * 4
                            )))
                    (dtable,dtable,dtable,method_to_replace,
                     &DAT_001205d8 +
                     *(int *)(&DAT_001205d8 +
                             (ulong)(dtable->shift << 0x1d | dtable->shift >> 3) * 4));
  return BVar1;
}

Assistant:

static BOOL installMethodInDtable(Class class,
                                  SparseArray *dtable,
                                  struct objc_method *method,
                                  struct objc_method *method_to_replace,
                                  BOOL replaceExisting)
{
	ASSERT(uninstalled_dtable != dtable);
	uint32_t sel_id = method->selector->index;
	struct objc_method *oldMethod = SparseArrayLookup(dtable, sel_id);
	// If we're being asked to replace an existing method, don't if it's the
	// wrong one.
	if ((replaceExisting) && (method_to_replace != oldMethod))
	{
		return NO;
	}
	// If we're not being asked to replace existing methods and there is an
	// existing one, don't replace it.
	if (!replaceExisting && (oldMethod != NULL))
	{
		return NO;
	}
	// If this method is the one already installed, pretend to install it again.
	if (NULL != oldMethod && (oldMethod->imp == method->imp))
	{
		return NO;
	}
	SparseArrayInsert(dtable, sel_id, method);
	// In TDD mode, we also register the first typed method that we
	// encounter as the untyped version.
#ifdef TYPE_DEPENDENT_DISPATCH
	uint32_t untyped_idx = get_untyped_idx(method->selector);
	SparseArrayInsert(dtable, untyped_idx, method);
#endif

	static SEL cxx_construct, cxx_destruct;
	if (NULL == cxx_construct)
	{
		cxx_construct = sel_registerName(".cxx_construct");
		cxx_destruct = sel_registerName(".cxx_destruct");
	}
	if (selEqualUnTyped(method->selector, cxx_construct))
	{
		class->cxx_construct = method->imp;
	}
	else if (selEqualUnTyped(method->selector, cxx_destruct))
	{
		class->cxx_destruct = method->imp;
	}

	for (struct objc_class *subclass=class->subclass_list ; 
		Nil != subclass ; subclass = subclass->sibling_class)
	{
		// Don't bother updating dtables for subclasses that haven't been
		// initialized yet
		if (!classHasDtable(subclass)) { continue; }

		// Recursively install this method in all subclasses
		installMethodInDtable(subclass,
		                      dtable_for_class(subclass),
		                      method,
		                      oldMethod,
		                      YES);
	}

	// Invalidate the old slot, if there is one.
	if (NULL != oldMethod)
	{
#ifndef NO_SAFE_CACHING
		objc_method_cache_version++;
#endif
	}
	return YES;
}